

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O1

void __thiscall
deqp::gls::StateChangePerformanceCase::requireSamplers(StateChangePerformanceCase *this,int count)

{
  iterator __position;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLuint sampler;
  uint local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  if ((int)((ulong)((long)(this->m_samplers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_samplers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_samplers;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(long)count);
    if ((int)((ulong)((long)(this->m_samplers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->m_samplers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < count) {
      do {
        (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f0))(1,&local_3c);
        err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
        glu::checkError(err,"glGenSamplers()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x1c8);
        __position._M_current =
             (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_38,__position,&local_3c);
        }
        else {
          *__position._M_current = local_3c;
          (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      } while ((int)((ulong)((long)(this->m_samplers).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_samplers).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) < count);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireSamplers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_samplers.size() >= count)
		return;

	m_samplers.reserve(count);

	while ((int)m_samplers.size() < count)
	{
		GLuint sampler;
		gl.genSamplers(1, &sampler);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenSamplers()");
		m_samplers.push_back(sampler);
	}
}